

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.h
# Opt level: O2

bool CNscPStackEntry::IsSimpleVariable(uchar *pauchData,size_t nDataSize)

{
  if ((((nDataSize != 0) && (*(size_t *)pauchData == nDataSize)) && (*(int *)(pauchData + 8) == 0))
     && ((*(uint *)(pauchData + 0x28) & 0x3c) == 0)) {
    return -1 < (char)*(uint *)(pauchData + 0x28);
  }
  return false;
}

Assistant:

static bool IsSimpleVariable (const unsigned char *pauchData, size_t nDataSize) 
	{
		NscPCodeVariable *pv = (NscPCodeVariable *) pauchData;
		return nDataSize != 0 &&
			pv ->nOpSize == nDataSize &&
			pv ->nOpCode == NscPCode_Variable &&
			(pv ->ulFlags & NscSymFlag_Increments) == 0 &&
			(pv ->ulFlags & NscSymFlag_Constant) == 0;
	}